

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::shutdownWrite(PromisedAsyncIoStream *this)

{
  AsyncIoStream *pAVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_30;
  PromiseBase local_28;
  
  pAVar1 = (this->stream).ptr.ptr;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[6])();
    return;
  }
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffd0);
  OVar3.ptr = local_30.ptr;
  pPVar2 = ((local_30.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_30.ptr - (long)pPVar2) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&stack0xffffffffffffffd0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2462:42)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006e0a98;
    *(PromisedAsyncIoStream **)((long)pvVar4 + 0x3f8) = this;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_30.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_30.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&stack0xffffffffffffffd0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2462:42)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006e0a98;
    OVar3.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)this;
    OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  local_28.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this_00;
  TaskSet::add(&this->tasks,(Promise<void> *)&stack0xffffffffffffffd8);
  OVar3.ptr = (PromiseNode *)local_28.node.ptr;
  if (local_28.node.ptr != (PromiseNode *)0x0) {
    local_28.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_30.ptr;
  if (&(local_30.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_30.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  return;
}

Assistant:

void shutdownWrite() override {
    KJ_IF_SOME(s, stream) {
      return s->shutdownWrite();
    } else {
      tasks.add(promise.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(stream)->shutdownWrite();
      }));
    }
  }